

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

int __thiscall
JsUtil::
BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
          (BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,FunctionBody **key,FunctionBody **value)

{
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
  *pSVar1;
  code *pcVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int **ppiVar6;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
  **ppSVar7;
  undefined4 *puVar8;
  long lVar9;
  uint local_70;
  int local_6c;
  uint depth;
  int profileIndex;
  WriteBarrierPtr<Js::FunctionBody> local_60;
  int local_54;
  int index;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
  *pSStack_48;
  int i;
  EntryType *localEntries;
  uint depth_1;
  uint targetBucket;
  hash_t hashCode;
  bool needSearch;
  int *localBuckets;
  FunctionBody **value_local;
  FunctionBody **key_local;
  BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  localBuckets = (int *)value;
  value_local = key;
  key_local = (FunctionBody **)this;
  ppiVar6 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
  _hashCode = *ppiVar6;
  if (_hashCode == (int *)0x0) {
    BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    ppiVar6 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
    _hashCode = *ppiVar6;
  }
  targetBucket._3_1_ = 1;
  depth_1 = BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::GetHashCode(value_local);
  localEntries._4_4_ =
       BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
       ::GetBucket((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)this,depth_1);
  localEntries._0_4_ = 0;
  ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                      ((WriteBarrierPtr *)(this + 8));
  pSStack_48 = *ppSVar7;
  index = _hashCode[localEntries._4_4_];
  while( true ) {
    if (index < 0) {
      if (*(long *)(this + 0x30) != 0) {
        DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),(uint)localEntries);
      }
      bVar4 = anon_unknown_4::
              ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
              ::SupportsCleanup();
      if (((bVar4) && (*(int *)(this + 0x28) == 0)) &&
         (*(int *)(this + 0x20) == *(int *)(this + 0x18))) {
        MapAndRemoveIf<JsUtil::BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::Insert<(JsUtil::BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>(Js::FunctionBody*const&,Js::FunctionBody*const&)::_lambda(JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,Memory::WriteBarrierPtr<Js::FunctionBody>>&)_1_>
                  (this);
      }
      if (*(int *)(this + 0x28) == 0) {
        if (*(int *)(this + 0x20) == *(int *)(this + 0x18)) {
          BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::Resize((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)this);
          localEntries._4_4_ =
               BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               ::GetBucket((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                            *)this,depth_1);
          local_54 = *(int *)(this + 0x20);
          *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
        }
        else {
          local_54 = *(int *)(this + 0x20);
          *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
        }
        if (*(int *)(this + 0x18) < *(int *)(this + 0x20)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3f1,"(count <= size)","count <= size");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (*(int *)(this + 0x18) <= local_54) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3f2,"(index < size)","index < size");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
      }
      else {
        if (*(int *)(this + 0x28) < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3d4,"(freeCount > 0)","freeCount > 0");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (*(int *)(this + 0x24) < 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3d5,"(freeList >= 0)","freeList >= 0");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3d6,"(freeList < count)","freeList < count");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        local_54 = *(int *)(this + 0x24);
        *(int *)(this + 0x28) = *(int *)(this + 0x28) + -1;
        if (*(int *)(this + 0x28) != 0) {
          ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                              ((WriteBarrierPtr *)(this + 8));
          iVar5 = BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::GetNextFreeEntryIndex(*ppSVar7 + local_54);
          *(int *)(this + 0x24) = iVar5;
        }
      }
      ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                          ((WriteBarrierPtr *)(this + 8));
      pSVar1 = *ppSVar7;
      lVar9 = (long)local_54;
      Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierPtr(&local_60,*value_local);
      Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierPtr
                ((WriteBarrierPtr<Js::FunctionBody> *)&depth,*(FunctionBody **)localBuckets);
      DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      ::Set(&pSVar1[lVar9].
             super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            ,&local_60,(WriteBarrierPtr<Js::FunctionBody> *)&depth,depth_1);
      ppiVar6 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
      iVar5 = (*ppiVar6)[localEntries._4_4_];
      ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                          ((WriteBarrierPtr *)(this + 8));
      iVar3 = local_54;
      (*ppSVar7)[local_54].
      super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      .
      super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
      .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.next = iVar5;
      ppiVar6 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
      (*ppiVar6)[localEntries._4_4_] = iVar3;
      local_6c = local_54;
      local_70 = 1;
      while (ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                                 ((WriteBarrierPtr *)(this + 8)),
            (*ppSVar7)[local_6c].
            super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            .
            super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
            .
            super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
            .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.next != -1) {
        ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                            ((WriteBarrierPtr *)(this + 8));
        local_6c = (*ppSVar7)[local_6c].
                   super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                   .
                   super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                   .
                   super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                   .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.next;
        local_70 = local_70 + 1;
      }
      if (*(long *)(this + 0x30) != 0) {
        DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),local_70);
      }
      return local_54;
    }
    bVar4 = DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,Memory::WriteBarrierPtr<Js::FunctionBody>,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            ::KeyEquals<DefaultComparer<Js::FunctionBody*>,Js::FunctionBody*>
                      ((DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,Memory::WriteBarrierPtr<Js::FunctionBody>,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                        *)(pSStack_48 + index),value_local,depth_1);
    if (bVar4) break;
    localEntries._0_4_ = (uint)localEntries + 1;
    index = pSStack_48[index].
            super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            .
            super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
            .
            super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
            .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.next;
  }
  if (*(long *)(this + 0x30) != 0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),(uint)localEntries);
  }
  return -1;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }